

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O1

void aom_highbd_lpf_vertical_14_sse2
               (uint16_t *s,int pitch,uint8_t *blimit,uint8_t *limit,uint8_t *thresh,int bd)

{
  uint16_t *puVar1;
  uint16_t *puVar2;
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  uint16_t uVar22;
  uint16_t uVar23;
  uint16_t uVar24;
  uint16_t uVar25;
  uint16_t uVar26;
  uint16_t uVar27;
  uint16_t uVar28;
  uint16_t uVar29;
  uint16_t uVar30;
  uint16_t uVar31;
  uint16_t uVar32;
  uint16_t uVar33;
  uint16_t uVar34;
  uint16_t uVar35;
  uint16_t uVar36;
  uint16_t uVar37;
  uint16_t uVar38;
  uint16_t uVar39;
  uint16_t uVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [12];
  undefined1 auVar55 [12];
  undefined1 auVar56 [12];
  undefined1 auVar57 [12];
  undefined1 auVar58 [12];
  undefined1 auVar59 [12];
  undefined1 auVar60 [12];
  undefined1 auVar61 [12];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [16];
  undefined1 auVar69 [12];
  unkbyte10 Var70;
  unkbyte10 Var71;
  unkbyte10 Var72;
  unkbyte10 Var73;
  unkbyte10 Var74;
  unkbyte10 Var75;
  short sVar76;
  short sVar77;
  short sVar78;
  short sVar79;
  short sVar80;
  ushort uVar81;
  short sVar82;
  short sVar83;
  short sVar84;
  short sVar85;
  short sVar86;
  short sVar87;
  short sVar88;
  short sVar89;
  long lVar90;
  long lVar91;
  long lVar92;
  undefined4 uVar93;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar100 [12];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  short sVar110;
  undefined4 uVar111;
  short sVar120;
  short sVar121;
  undefined2 uVar122;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  short sVar119;
  undefined1 auVar118 [16];
  undefined1 auVar123 [12];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  short sVar129;
  short sVar144;
  short sVar146;
  short sVar148;
  undefined1 auVar130 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  ushort uVar149;
  undefined4 uVar150;
  ushort uVar161;
  ushort uVar162;
  ushort uVar163;
  ushort uVar164;
  ushort uVar165;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  ushort uVar160;
  ushort uVar166;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  short sVar167;
  short sVar181;
  short sVar183;
  short sVar185;
  short sVar186;
  short sVar187;
  short sVar188;
  undefined1 auVar168 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  short sVar189;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  short sVar190;
  short sVar193;
  short sVar194;
  short sVar195;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  short sVar201;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  short sVar202;
  undefined1 auVar200 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  short sVar208;
  short sVar209;
  short sVar210;
  short sVar211;
  short sVar212;
  short sVar213;
  undefined1 auVar214 [16];
  short sVar215;
  short sVar216;
  short sVar217;
  short sVar218;
  short sVar219;
  short sVar220;
  short sVar221;
  short sVar222;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  __m128i q [7];
  __m128i flat_pq [3];
  __m128i p [7];
  undefined1 auStack_2a8 [16];
  short local_298;
  short sStack_296;
  short sStack_294;
  short sStack_292;
  short sStack_290;
  short sStack_28e;
  short sStack_28c;
  ushort uStack_28a;
  short local_288;
  short sStack_286;
  short sStack_284;
  short sStack_282;
  short sStack_280;
  short sStack_27e;
  short sStack_27c;
  short sStack_27a;
  short local_278;
  short sStack_276;
  short sStack_274;
  short sStack_272;
  short sStack_270;
  short sStack_26e;
  short sStack_26c;
  ushort uStack_26a;
  short local_268;
  short sStack_266;
  short sStack_264;
  short sStack_262;
  short sStack_260;
  short sStack_25e;
  short sStack_25c;
  short sStack_25a;
  short local_258;
  short sStack_256;
  short sStack_254;
  short sStack_252;
  short sStack_250;
  short sStack_24e;
  short sStack_24c;
  ushort uStack_24a;
  short local_248;
  short sStack_246;
  short sStack_244;
  short sStack_242;
  short sStack_240;
  short sStack_23e;
  short sStack_23c;
  short sStack_23a;
  undefined1 local_238 [16];
  undefined8 local_1f8 [6];
  undefined1 local_1c8 [16];
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  ulong local_198;
  undefined8 uStack_190;
  ushort local_108;
  ushort uStack_106;
  ushort uStack_104;
  ushort uStack_102;
  ushort uStack_100;
  ushort uStack_fe;
  ushort uStack_fc;
  ushort uStack_fa;
  ushort local_f8;
  ushort uStack_f6;
  ushort uStack_f4;
  ushort uStack_f2;
  ushort uStack_f0;
  ushort uStack_ee;
  ushort uStack_ec;
  ushort uStack_ea;
  ushort local_e8;
  ushort uStack_e6;
  ushort uStack_e4;
  ushort uStack_e2;
  ushort uStack_e0;
  ushort uStack_de;
  ushort uStack_dc;
  ushort uStack_da;
  ushort local_d8;
  ushort uStack_d6;
  ushort uStack_d4;
  ushort uStack_d2;
  ushort uStack_d0;
  ushort uStack_ce;
  ushort uStack_cc;
  ushort uStack_ca;
  ushort local_c8;
  ushort uStack_c6;
  ushort uStack_c4;
  ushort uStack_c2;
  ushort uStack_c0;
  ushort uStack_be;
  ushort uStack_bc;
  ushort uStack_ba;
  ushort local_b8;
  ushort uStack_b6;
  ushort uStack_b4;
  ushort uStack_b2;
  ushort uStack_b0;
  ushort uStack_ae;
  ushort uStack_ac;
  ushort uStack_aa;
  ushort local_a8;
  ushort uStack_a6;
  ushort uStack_a4;
  ushort uStack_a2;
  ushort uStack_a0;
  ushort uStack_9e;
  ushort uStack_9c;
  ushort uStack_9a;
  ushort local_98;
  ushort uStack_96;
  ushort uStack_94;
  ushort uStack_92;
  ushort uStack_90;
  ushort uStack_8e;
  ushort uStack_8c;
  ushort uStack_8a;
  ushort uStack_88;
  ushort uStack_86;
  ushort uStack_84;
  ushort uStack_82;
  __m128i pq [7];
  undefined1 auVar94 [12];
  undefined1 auVar99 [16];
  undefined1 auVar101 [16];
  undefined1 auVar112 [12];
  undefined1 auVar134 [16];
  undefined1 auVar141 [16];
  undefined1 auVar131 [16];
  undefined1 auVar135 [16];
  undefined1 auVar142 [16];
  short sVar143;
  short sVar145;
  short sVar147;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar158 [16];
  undefined1 auVar153 [16];
  undefined1 auVar159 [16];
  undefined1 auVar169 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  short sVar180;
  short sVar182;
  short sVar184;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  
  auVar98 = *(undefined1 (*) [16])(s + -8);
  puVar1 = s + (long)pitch + -8;
  uVar22 = *puVar1;
  uVar23 = puVar1[1];
  lVar91 = (long)(pitch * 2);
  auVar99 = *(undefined1 (*) [16])(s + lVar91 + -8);
  lVar92 = (long)(pitch * 3);
  puVar2 = s + lVar92 + -8;
  uVar24 = *puVar2;
  uVar25 = puVar2[1];
  auVar131._0_12_ = auVar98._0_12_;
  auVar131._12_2_ = auVar98._6_2_;
  auVar131._14_2_ = puVar1[3];
  auVar130._12_4_ = auVar131._12_4_;
  auVar130._0_10_ = auVar98._0_10_;
  auVar130._10_2_ = puVar1[2];
  auVar203._10_6_ = auVar130._10_6_;
  auVar203._0_8_ = auVar98._0_8_;
  auVar203._8_2_ = auVar98._4_2_;
  auVar47._4_8_ = auVar203._8_8_;
  auVar47._2_2_ = uVar23;
  auVar47._0_2_ = auVar98._2_2_;
  auVar95._0_8_ = auVar47._0_8_ << 0x20;
  auVar153._0_12_ = auVar99._0_12_;
  auVar153._12_2_ = auVar99._6_2_;
  auVar153._14_2_ = puVar2[3];
  auVar152._12_4_ = auVar153._12_4_;
  auVar152._0_10_ = auVar99._0_10_;
  auVar152._10_2_ = puVar2[2];
  auVar151._10_6_ = auVar152._10_6_;
  auVar151._0_8_ = auVar99._0_8_;
  auVar151._8_2_ = auVar99._4_2_;
  auVar48._4_8_ = auVar151._8_8_;
  auVar48._2_2_ = uVar25;
  auVar48._0_2_ = auVar99._2_2_;
  uVar150 = CONCAT22(uVar24,auVar99._0_2_);
  auVar95._8_4_ = auVar47._0_4_;
  auVar95._12_4_ = auVar48._0_4_;
  auVar132._0_8_ = CONCAT44(auVar151._8_4_,auVar203._8_4_);
  auVar132._8_4_ = auVar130._12_4_;
  auVar132._12_4_ = auVar152._12_4_;
  pq[6][1] = auVar95._8_8_;
  pq[5][1] = auVar132._0_8_;
  pq[6][0] = 0;
  pq[4][1] = SUB168(auVar132 >> 0x40,0);
  pq[5][0] = SUB168(auVar132 >> 0x40,8);
  uVar93 = CONCAT22(puVar1[4],auVar98._8_2_);
  auVar100._0_8_ = CONCAT26(puVar1[5],CONCAT24(auVar98._10_2_,uVar93));
  auVar100._8_2_ = auVar98._12_2_;
  auVar100._10_2_ = puVar1[6];
  auVar101._12_2_ = auVar98._14_2_;
  auVar101._0_12_ = auVar100;
  auVar101._14_2_ = puVar1[7];
  uVar111 = CONCAT22(puVar2[4],auVar99._8_2_);
  auVar123._0_8_ = CONCAT26(puVar2[5],CONCAT24(auVar99._10_2_,uVar111));
  auVar123._8_2_ = auVar99._12_2_;
  auVar123._10_2_ = puVar2[6];
  auVar173._12_2_ = auVar99._14_2_;
  auVar173._0_12_ = auVar123;
  auVar173._14_2_ = puVar2[7];
  auVar102._8_4_ = (int)((ulong)auVar100._0_8_ >> 0x20);
  auVar102._0_8_ = auVar100._0_8_;
  auVar102._12_4_ = (int)((ulong)auVar123._0_8_ >> 0x20);
  auVar118._0_8_ = CONCAT44(auVar123._8_4_,auVar100._8_4_);
  auVar118._8_4_ = auVar101._12_4_;
  auVar118._12_4_ = auVar173._12_4_;
  pq[3][1] = CONCAT44(uVar111,uVar93);
  pq[4][0] = 0;
  pq[2][1] = auVar102._8_8_;
  pq[3][0] = 0;
  pq[1][1] = auVar118._0_8_;
  pq[2][0] = 0;
  pq[0][1] = SUB168(auVar118 >> 0x40,0);
  pq[1][0] = SUB168(auVar118 >> 0x40,8);
  auVar101 = *(undefined1 (*) [16])s;
  puVar1 = s + pitch;
  uVar26 = *puVar1;
  uVar27 = puVar1[1];
  uVar28 = puVar1[2];
  uVar29 = puVar1[3];
  uVar30 = puVar1[4];
  uVar31 = puVar1[5];
  uVar32 = puVar1[6];
  uVar33 = puVar1[7];
  auVar118 = *(undefined1 (*) [16])(s + lVar91);
  puVar1 = s + lVar92;
  uVar34 = *puVar1;
  uVar35 = puVar1[1];
  uVar36 = puVar1[2];
  uVar37 = puVar1[3];
  uVar38 = puVar1[4];
  uVar39 = puVar1[5];
  uVar40 = puVar1[6];
  sVar184 = auVar101._6_2_;
  auVar171._0_12_ = auVar101._0_12_;
  auVar171._12_2_ = sVar184;
  auVar171._14_2_ = uVar29;
  auVar170._12_4_ = auVar171._12_4_;
  auVar170._0_10_ = auVar101._0_10_;
  auVar170._10_2_ = uVar28;
  sVar182 = auVar101._4_2_;
  auVar169._10_6_ = auVar170._10_6_;
  auVar169._0_8_ = auVar101._0_8_;
  auVar169._8_2_ = sVar182;
  auVar49._4_8_ = auVar169._8_8_;
  auVar49._2_2_ = uVar27;
  sVar180 = auVar101._2_2_;
  auVar49._0_2_ = sVar180;
  sVar193 = auVar101._0_2_;
  auVar168._0_4_ = CONCAT22(uVar26,sVar193);
  auVar168._4_12_ = auVar49;
  sVar147 = auVar118._6_2_;
  auVar135._0_12_ = auVar118._0_12_;
  auVar135._12_2_ = sVar147;
  auVar135._14_2_ = uVar37;
  auVar134._12_4_ = auVar135._12_4_;
  auVar134._0_10_ = auVar118._0_10_;
  auVar134._10_2_ = uVar36;
  sVar145 = auVar118._4_2_;
  auVar133._10_6_ = auVar134._10_6_;
  auVar133._0_8_ = auVar118._0_8_;
  auVar133._8_2_ = sVar145;
  auVar50._4_8_ = auVar133._8_8_;
  auVar50._2_2_ = uVar35;
  sVar143 = auVar118._2_2_;
  auVar50._0_2_ = sVar143;
  sVar190 = auVar118._0_2_;
  auVar197._0_8_ = auVar168._0_8_;
  auVar197._8_4_ = auVar49._0_4_;
  auVar197._12_4_ = auVar50._0_4_;
  auVar172._0_8_ = CONCAT44(auVar133._8_4_,auVar169._8_4_);
  auVar172._8_4_ = auVar170._12_4_;
  auVar172._12_4_ = auVar134._12_4_;
  local_1f8[0] = CONCAT44(CONCAT22(uVar34,sVar190),auVar168._0_4_);
  local_1f8[1] = 0;
  local_1f8[2] = auVar197._8_8_;
  local_1f8[3] = 0;
  local_1f8[4] = auVar172._0_8_;
  local_1f8[5] = 0;
  local_1c8 = auVar172 >> 0x40;
  uVar93 = CONCAT22(uVar30,auVar101._8_2_);
  auVar94._0_8_ = CONCAT26(uVar31,CONCAT24(auVar101._10_2_,uVar93));
  auVar94._8_2_ = auVar101._12_2_;
  auVar94._10_2_ = uVar32;
  uVar111 = CONCAT22(uVar38,auVar118._8_2_);
  auVar112._0_8_ = CONCAT26(uVar39,CONCAT24(auVar118._10_2_,uVar111));
  uVar122 = auVar118._12_2_;
  auVar112._8_2_ = uVar122;
  auVar112._10_2_ = uVar40;
  auVar191._8_4_ = (int)((ulong)auVar94._0_8_ >> 0x20);
  auVar191._0_8_ = auVar94._0_8_;
  auVar191._12_4_ = (int)((ulong)auVar112._0_8_ >> 0x20);
  local_198 = CONCAT44(auVar112._8_4_,auVar94._8_4_);
  local_1b8 = CONCAT44(uVar111,uVar93);
  uStack_1b0 = 0;
  local_1a8 = auVar191._8_8_;
  uStack_1a0 = 0;
  uStack_190 = 0;
  auVar102 = *(undefined1 (*) [16])blimit;
  auVar5[0xd] = 0;
  auVar5._0_13_ = auVar102._0_13_;
  auVar5[0xe] = auVar102[7];
  auVar8[0xc] = auVar102[6];
  auVar8._0_12_ = auVar102._0_12_;
  auVar8._13_2_ = auVar5._13_2_;
  auVar11[0xb] = 0;
  auVar11._0_11_ = auVar102._0_11_;
  auVar11._12_3_ = auVar8._12_3_;
  auVar14[10] = auVar102[5];
  auVar14._0_10_ = auVar102._0_10_;
  auVar14._11_4_ = auVar11._11_4_;
  auVar17[9] = 0;
  auVar17._0_9_ = auVar102._0_9_;
  auVar17._10_5_ = auVar14._10_5_;
  auVar20[8] = auVar102[4];
  auVar20._0_8_ = auVar102._0_8_;
  auVar20._9_6_ = auVar17._9_6_;
  auVar51._7_8_ = 0;
  auVar51._0_7_ = auVar20._8_7_;
  auVar62._1_8_ = SUB158(auVar51 << 0x40,7);
  auVar62[0] = auVar102[3];
  auVar62._9_6_ = 0;
  auVar63._1_10_ = SUB1510(auVar62 << 0x30,5);
  auVar63[0] = auVar102[2];
  auVar63._11_4_ = 0;
  auVar113._3_12_ = SUB1512(auVar63 << 0x20,3);
  auVar113[2] = auVar102[1];
  auVar113[0] = auVar102[0];
  auVar113[1] = 0;
  auVar113[0xf] = 0;
  auVar102 = *(undefined1 (*) [16])limit;
  auVar3[0xd] = 0;
  auVar3._0_13_ = auVar102._0_13_;
  auVar3[0xe] = auVar102[7];
  auVar6[0xc] = auVar102[6];
  auVar6._0_12_ = auVar102._0_12_;
  auVar6._13_2_ = auVar3._13_2_;
  auVar9[0xb] = 0;
  auVar9._0_11_ = auVar102._0_11_;
  auVar9._12_3_ = auVar6._12_3_;
  auVar12[10] = auVar102[5];
  auVar12._0_10_ = auVar102._0_10_;
  auVar12._11_4_ = auVar9._11_4_;
  auVar15[9] = 0;
  auVar15._0_9_ = auVar102._0_9_;
  auVar15._10_5_ = auVar12._10_5_;
  auVar18[8] = auVar102[4];
  auVar18._0_8_ = auVar102._0_8_;
  auVar18._9_6_ = auVar15._9_6_;
  auVar52._7_8_ = 0;
  auVar52._0_7_ = auVar18._8_7_;
  auVar64._1_8_ = SUB158(auVar52 << 0x40,7);
  auVar64[0] = auVar102[3];
  auVar64._9_6_ = 0;
  auVar65._1_10_ = SUB1510(auVar64 << 0x30,5);
  auVar65[0] = auVar102[2];
  auVar65._11_4_ = 0;
  auVar21[2] = auVar102[1];
  auVar21._0_2_ = auVar102._0_2_;
  auVar21._3_12_ = SUB1512(auVar65 << 0x20,3);
  auVar196._0_2_ = auVar102._0_2_ & 0xff;
  auVar196._2_13_ = auVar21._2_13_;
  auVar196[0xf] = 0;
  auVar102 = *(undefined1 (*) [16])thresh;
  auVar4[0xd] = 0;
  auVar4._0_13_ = auVar102._0_13_;
  auVar4[0xe] = auVar102[7];
  auVar7[0xc] = auVar102[6];
  auVar7._0_12_ = auVar102._0_12_;
  auVar7._13_2_ = auVar4._13_2_;
  auVar10[0xb] = 0;
  auVar10._0_11_ = auVar102._0_11_;
  auVar10._12_3_ = auVar7._12_3_;
  auVar13[10] = auVar102[5];
  auVar13._0_10_ = auVar102._0_10_;
  auVar13._11_4_ = auVar10._11_4_;
  auVar16[9] = 0;
  auVar16._0_9_ = auVar102._0_9_;
  auVar16._10_5_ = auVar13._10_5_;
  auVar19[8] = auVar102[4];
  auVar19._0_8_ = auVar102._0_8_;
  auVar19._9_6_ = auVar16._9_6_;
  auVar53._7_8_ = 0;
  auVar53._0_7_ = auVar19._8_7_;
  auVar66._1_8_ = SUB158(auVar53 << 0x40,7);
  auVar66[0] = auVar102[3];
  auVar66._9_6_ = 0;
  auVar67._1_10_ = SUB1510(auVar66 << 0x30,5);
  auVar67[0] = auVar102[2];
  auVar67._11_4_ = 0;
  auVar154._3_12_ = SUB1512(auVar67 << 0x20,3);
  auVar154[2] = auVar102[1];
  auVar154[0] = auVar102[0];
  auVar154[1] = 0;
  auVar154[0xf] = 0;
  lVar90 = 0;
  do {
    *(undefined8 *)((long)&local_298 + lVar90) = *(undefined8 *)((long)pq[0] + lVar90 + 8);
    sVar77 = sStack_292;
    sVar76 = sStack_294;
    sVar195 = sStack_296;
    sVar194 = local_298;
    *(undefined8 *)((long)&sStack_290 + lVar90) = *(undefined8 *)((long)local_1f8 + lVar90);
    sVar89 = sStack_27a;
    sVar88 = sStack_27c;
    sVar87 = sStack_27e;
    sVar86 = sStack_280;
    sVar85 = sStack_282;
    sVar84 = sStack_284;
    sVar83 = sStack_286;
    sVar82 = local_288;
    uVar81 = uStack_28a;
    sVar80 = sStack_28c;
    sVar79 = sStack_28e;
    sVar78 = sStack_290;
    lVar90 = lVar90 + 0x10;
  } while (lVar90 != 0x70);
  auVar203 = ZEXT416(bd - 8);
  auVar113 = psllw(auVar113,auVar203);
  auVar197 = psllw(auVar196,auVar203);
  auVar102 = psllw(auVar154,auVar203);
  auVar96._2_2_ = sStack_296;
  auVar96._0_2_ = local_298;
  auVar96._4_2_ = sStack_294;
  auVar96._6_2_ = sStack_292;
  auVar126._2_2_ = sStack_28e;
  auVar126._0_2_ = sStack_290;
  auVar126._4_2_ = sStack_28c;
  auVar126._6_2_ = uStack_28a;
  auVar96._10_2_ = sStack_286;
  auVar96._8_2_ = local_288;
  auVar96._12_2_ = sStack_284;
  auVar96._14_2_ = sStack_282;
  auVar126._10_2_ = sStack_27e;
  auVar126._8_2_ = sStack_280;
  auVar126._12_2_ = sStack_27c;
  auVar126._14_2_ = sStack_27a;
  auVar154 = psubusw(auVar96,auVar126);
  auVar173 = psubusw(auVar126,auVar96);
  auVar173 = auVar173 | auVar154;
  auVar154 = paddusw(auVar173,auVar173);
  auVar155._0_8_ = auVar154._0_8_;
  auVar155._8_8_ = 0;
  auVar174._0_2_ = auVar173._8_2_ >> 1;
  auVar174._2_2_ = auVar173._10_2_ >> 1;
  auVar174._4_2_ = auVar173._12_2_ >> 1;
  auVar174._6_2_ = auVar173._14_2_ >> 1;
  auVar174._8_8_ = 0;
  auVar154 = paddusw(auVar174,auVar155);
  auVar154 = auVar154 ^ _DAT_004dab60;
  auVar113 = auVar113 ^ _DAT_004dab60;
  auVar175._0_2_ = -(ushort)(auVar113._0_2_ < auVar154._0_2_);
  auVar175._2_2_ = -(ushort)(auVar113._2_2_ < auVar154._2_2_);
  auVar175._4_2_ = -(ushort)(auVar113._4_2_ < auVar154._4_2_);
  auVar175._6_2_ = -(ushort)(auVar113._6_2_ < auVar154._6_2_);
  auVar175._8_2_ = -(ushort)(auVar113._8_2_ < auVar154._8_2_);
  auVar175._10_2_ = -(ushort)(auVar113._10_2_ < auVar154._10_2_);
  auVar175._12_2_ = -(ushort)(auVar113._12_2_ < auVar154._12_2_);
  auVar175._14_2_ = -(ushort)(auVar113._14_2_ < auVar154._14_2_);
  auVar113 = paddusw(_DAT_005154e0,auVar197);
  auVar113 = auVar113 & auVar175;
  auVar41._2_2_ = sStack_296;
  auVar41._0_2_ = local_298;
  auVar41._4_2_ = sStack_294;
  auVar41._6_2_ = sStack_292;
  auVar41._8_2_ = sStack_290;
  auVar41._10_2_ = sStack_28e;
  auVar41._12_2_ = sStack_28c;
  auVar41._14_2_ = uStack_28a;
  auVar42._2_2_ = sStack_286;
  auVar42._0_2_ = local_288;
  auVar42._4_2_ = sStack_284;
  auVar42._6_2_ = sStack_282;
  auVar42._8_2_ = sStack_280;
  auVar42._10_2_ = sStack_27e;
  auVar42._12_2_ = sStack_27c;
  auVar42._14_2_ = sStack_27a;
  auVar154 = psubusw(auVar41,auVar42);
  auVar173 = psubusw(auVar42,auVar41);
  auVar173 = auVar173 | auVar154;
  sVar167 = auVar173._0_2_;
  sVar186 = auVar173._8_2_;
  auVar114._0_2_ = (ushort)(sVar186 < sVar167) * sVar167 | (ushort)(sVar186 >= sVar167) * sVar186;
  sVar181 = auVar173._2_2_;
  sVar187 = auVar173._10_2_;
  auVar114._2_2_ = (ushort)(sVar187 < sVar181) * sVar181 | (ushort)(sVar187 >= sVar181) * sVar187;
  sVar183 = auVar173._4_2_;
  sVar188 = auVar173._12_2_;
  auVar114._4_2_ = (ushort)(sVar188 < sVar183) * sVar183 | (ushort)(sVar188 >= sVar183) * sVar188;
  sVar185 = auVar173._6_2_;
  sVar189 = auVar173._14_2_;
  auVar114._6_2_ = (ushort)(sVar189 < sVar185) * sVar185 | (ushort)(sVar189 >= sVar185) * sVar189;
  sVar119 = (ushort)(0 < sVar186) * sVar186;
  auVar114._8_2_ = sVar119;
  sVar110 = (ushort)(0 < sVar187) * sVar187;
  auVar114._10_2_ = sVar110;
  sVar120 = (ushort)(0 < sVar188) * sVar188;
  auVar114._12_2_ = sVar120;
  sVar121 = (ushort)(0 < sVar189) * sVar189;
  auVar114._14_2_ = sVar121;
  sVar129 = auVar113._0_2_;
  uVar149 = (sVar129 < (short)auVar114._0_2_) * auVar114._0_2_ |
            (ushort)(sVar129 >= (short)auVar114._0_2_) * sVar129;
  sVar129 = auVar113._2_2_;
  uVar160 = (sVar129 < (short)auVar114._2_2_) * auVar114._2_2_ |
            (ushort)(sVar129 >= (short)auVar114._2_2_) * sVar129;
  sVar129 = auVar113._4_2_;
  uVar161 = (sVar129 < (short)auVar114._4_2_) * auVar114._4_2_ |
            (ushort)(sVar129 >= (short)auVar114._4_2_) * sVar129;
  sVar129 = auVar113._6_2_;
  uVar162 = (sVar129 < (short)auVar114._6_2_) * auVar114._6_2_ |
            (ushort)(sVar129 >= (short)auVar114._6_2_) * sVar129;
  sVar129 = auVar113._8_2_;
  uVar163 = (ushort)(sVar129 < sVar119) * sVar119 | (ushort)(sVar129 >= sVar119) * sVar129;
  sVar119 = auVar113._10_2_;
  uVar164 = (ushort)(sVar119 < sVar110) * sVar110 | (ushort)(sVar119 >= sVar110) * sVar119;
  sVar110 = auVar113._12_2_;
  sVar119 = auVar113._14_2_;
  uVar165 = (ushort)(sVar110 < sVar120) * sVar120 | (ushort)(sVar110 >= sVar120) * sVar110;
  uVar166 = (ushort)(sVar119 < sVar121) * sVar121 | (ushort)(sVar119 >= sVar121) * sVar119;
  auVar114 = auVar114 ^ _DAT_004dab60;
  auVar102 = auVar102 ^ _DAT_004dab60;
  auVar115._0_4_ =
       CONCAT22(-(ushort)(auVar102._2_2_ < auVar114._2_2_),
                -(ushort)(auVar102._0_2_ < auVar114._0_2_));
  lVar90 = 0x20;
  do {
    auVar113 = psubusw(*(undefined1 (*) [16])((long)&local_298 + lVar90),
                       *(undefined1 (*) [16])(auStack_2a8 + lVar90));
    auVar154 = psubusw(*(undefined1 (*) [16])(auStack_2a8 + lVar90),
                       *(undefined1 (*) [16])((long)&local_298 + lVar90));
    auVar154 = auVar154 | auVar113;
    sVar110 = auVar154._0_2_;
    uVar149 = (ushort)((short)uVar149 < sVar110) * sVar110 | ((short)uVar149 >= sVar110) * uVar149;
    sVar110 = auVar154._2_2_;
    uVar160 = (ushort)((short)uVar160 < sVar110) * sVar110 | ((short)uVar160 >= sVar110) * uVar160;
    sVar110 = auVar154._4_2_;
    uVar161 = (ushort)((short)uVar161 < sVar110) * sVar110 | ((short)uVar161 >= sVar110) * uVar161;
    sVar110 = auVar154._6_2_;
    uVar162 = (ushort)((short)uVar162 < sVar110) * sVar110 | ((short)uVar162 >= sVar110) * uVar162;
    sVar110 = auVar154._8_2_;
    uVar163 = (ushort)((short)uVar163 < sVar110) * sVar110 | ((short)uVar163 >= sVar110) * uVar163;
    sVar110 = auVar154._10_2_;
    uVar164 = (ushort)((short)uVar164 < sVar110) * sVar110 | ((short)uVar164 >= sVar110) * uVar164;
    sVar110 = auVar154._12_2_;
    uVar165 = (ushort)((short)uVar165 < sVar110) * sVar110 | ((short)uVar165 >= sVar110) * uVar165;
    sVar110 = auVar154._14_2_;
    uVar166 = (ushort)((short)uVar166 < sVar110) * sVar110 | ((short)uVar166 >= sVar110) * uVar166;
    lVar90 = lVar90 + 0x10;
  } while (lVar90 != 0x40);
  auVar154 = pshuflw(auVar154,ZEXT416((uint)(1 << ((char)bd - 1U & 0x1f))),0);
  auVar103._0_4_ = auVar154._0_4_;
  auVar103._4_4_ = auVar103._0_4_;
  auVar103._8_4_ = auVar103._0_4_;
  auVar103._12_4_ = auVar103._0_4_;
  auVar115._4_4_ =
       (undefined4)
       (CONCAT26(-(ushort)(auVar102._6_2_ < auVar114._6_2_),
                 CONCAT24(-(ushort)(auVar102._4_2_ < auVar114._4_2_),auVar115._0_4_)) >> 0x20);
  auVar115._8_4_ = auVar115._0_4_;
  auVar115._12_4_ = auVar115._4_4_;
  auVar124._0_2_ =
       ((short)uVar163 < (short)uVar149) * uVar149 | ((short)uVar163 >= (short)uVar149) * uVar163;
  auVar124._2_2_ =
       ((short)uVar164 < (short)uVar160) * uVar160 | ((short)uVar164 >= (short)uVar160) * uVar164;
  auVar124._4_2_ =
       ((short)uVar165 < (short)uVar161) * uVar161 | ((short)uVar165 >= (short)uVar161) * uVar165;
  auVar124._6_2_ =
       ((short)uVar166 < (short)uVar162) * uVar162 | ((short)uVar166 >= (short)uVar162) * uVar166;
  auVar124._8_2_ = (0 < (short)uVar163) * uVar163;
  auVar124._10_2_ = (0 < (short)uVar164) * uVar164;
  auVar124._12_2_ = (0 < (short)uVar165) * uVar165;
  auVar124._14_2_ = (0 < (short)uVar166) * uVar166;
  auVar102 = psubusw(auVar124,auVar197);
  auVar154 = psllw(_DAT_005154e0,ZEXT416((uint)bd));
  auVar125._0_2_ = -(ushort)(auVar102._0_2_ == 0);
  auVar125._2_2_ = -(ushort)(auVar102._2_2_ == 0);
  auVar125._4_2_ = -(ushort)(auVar102._4_2_ == 0);
  auVar125._6_2_ = -(ushort)(auVar102._6_2_ == 0);
  auVar125._8_2_ = -(ushort)(auVar102._8_2_ == 0);
  auVar125._10_2_ = -(ushort)(auVar102._10_2_ == 0);
  auVar125._12_2_ = -(ushort)(auVar102._12_2_ == 0);
  auVar125._14_2_ = -(ushort)(auVar102._14_2_ == 0);
  auVar198._8_4_ = 0xffffffff;
  auVar198._0_8_ = 0xffffffffffffffff;
  auVar198._12_4_ = 0xffffffff;
  auVar102 = paddsw(auVar154,auVar198);
  auVar173 = psubsw(auVar102,auVar103);
  auVar197 = psubsw((undefined1  [16])0x0,auVar103);
  auVar102 = psubsw(auVar96,auVar103);
  auVar154 = psubsw(auVar126,auVar103);
  auVar113 = psubsw(auVar102,auVar154);
  sVar201 = auVar173._0_2_;
  sVar110 = auVar113._0_2_;
  uVar149 = (ushort)(sVar201 < sVar110) * sVar201 | (ushort)(sVar201 >= sVar110) * sVar110;
  sVar202 = auVar173._2_2_;
  sVar110 = auVar113._2_2_;
  uVar160 = (ushort)(sVar202 < sVar110) * sVar202 | (ushort)(sVar202 >= sVar110) * sVar110;
  sVar208 = auVar173._4_2_;
  sVar110 = auVar113._4_2_;
  uVar161 = (ushort)(sVar208 < sVar110) * sVar208 | (ushort)(sVar208 >= sVar110) * sVar110;
  sVar209 = auVar173._6_2_;
  sVar110 = auVar113._6_2_;
  uVar162 = (ushort)(sVar209 < sVar110) * sVar209 | (ushort)(sVar209 >= sVar110) * sVar110;
  sVar210 = auVar173._8_2_;
  sVar110 = auVar113._8_2_;
  uVar163 = (ushort)(sVar210 < sVar110) * sVar210 | (ushort)(sVar210 >= sVar110) * sVar110;
  sVar211 = auVar173._10_2_;
  sVar110 = auVar113._10_2_;
  uVar164 = (ushort)(sVar211 < sVar110) * sVar211 | (ushort)(sVar211 >= sVar110) * sVar110;
  sVar212 = auVar173._12_2_;
  sVar110 = auVar113._12_2_;
  sVar119 = auVar113._14_2_;
  uVar165 = (ushort)(sVar212 < sVar110) * sVar212 | (ushort)(sVar212 >= sVar110) * sVar110;
  sVar213 = auVar173._14_2_;
  uVar166 = (ushort)(sVar213 < sVar119) * sVar213 | (ushort)(sVar213 >= sVar119) * sVar119;
  sVar110 = auVar197._0_2_;
  auVar136._0_2_ =
       (ushort)((short)uVar149 < sVar110) * sVar110 | ((short)uVar149 >= sVar110) * uVar149;
  sVar119 = auVar197._2_2_;
  auVar136._2_2_ =
       (ushort)((short)uVar160 < sVar119) * sVar119 | ((short)uVar160 >= sVar119) * uVar160;
  sVar120 = auVar197._4_2_;
  auVar136._4_2_ =
       (ushort)((short)uVar161 < sVar120) * sVar120 | ((short)uVar161 >= sVar120) * uVar161;
  sVar121 = auVar197._6_2_;
  auVar136._6_2_ =
       (ushort)((short)uVar162 < sVar121) * sVar121 | ((short)uVar162 >= sVar121) * uVar162;
  sVar129 = auVar197._8_2_;
  auVar136._8_2_ =
       (ushort)((short)uVar163 < sVar129) * sVar129 | ((short)uVar163 >= sVar129) * uVar163;
  sVar144 = auVar197._10_2_;
  auVar136._10_2_ =
       (ushort)((short)uVar164 < sVar144) * sVar144 | ((short)uVar164 >= sVar144) * uVar164;
  sVar146 = auVar197._12_2_;
  auVar136._12_2_ =
       (ushort)((short)uVar165 < sVar146) * sVar146 | ((short)uVar165 >= sVar146) * uVar165;
  sVar148 = auVar197._14_2_;
  auVar136._14_2_ =
       (ushort)((short)uVar166 < sVar148) * sVar148 | ((short)uVar166 >= sVar148) * uVar166;
  auVar113 = psubsw(auVar136 >> 0x40 & auVar115,auVar136);
  auVar113 = psubsw(auVar113,auVar136);
  auVar113 = psubsw(auVar113,auVar136);
  sVar215 = auVar113._0_2_;
  uVar149 = (ushort)(sVar201 < sVar215) * sVar201 | (ushort)(sVar201 >= sVar215) * sVar215;
  sVar215 = auVar113._2_2_;
  uVar160 = (ushort)(sVar202 < sVar215) * sVar202 | (ushort)(sVar202 >= sVar215) * sVar215;
  sVar215 = auVar113._4_2_;
  uVar161 = (ushort)(sVar208 < sVar215) * sVar208 | (ushort)(sVar208 >= sVar215) * sVar215;
  sVar215 = auVar113._6_2_;
  uVar162 = (ushort)(sVar209 < sVar215) * sVar209 | (ushort)(sVar209 >= sVar215) * sVar215;
  sVar215 = auVar113._8_2_;
  uVar163 = (ushort)(sVar210 < sVar215) * sVar210 | (ushort)(sVar210 >= sVar215) * sVar215;
  sVar215 = auVar113._10_2_;
  uVar164 = (ushort)(sVar211 < sVar215) * sVar211 | (ushort)(sVar211 >= sVar215) * sVar215;
  sVar215 = auVar113._12_2_;
  sVar216 = auVar113._14_2_;
  uVar165 = (ushort)(sVar212 < sVar215) * sVar212 | (ushort)(sVar212 >= sVar215) * sVar215;
  uVar166 = (ushort)(sVar213 < sVar216) * sVar213 | (ushort)(sVar213 >= sVar216) * sVar216;
  auVar223._0_2_ =
       (ushort)((short)uVar149 < sVar110) * sVar110 | ((short)uVar149 >= sVar110) * uVar149;
  auVar223._2_2_ =
       (ushort)((short)uVar160 < sVar119) * sVar119 | ((short)uVar160 >= sVar119) * uVar160;
  auVar223._4_2_ =
       (ushort)((short)uVar161 < sVar120) * sVar120 | ((short)uVar161 >= sVar120) * uVar161;
  auVar223._6_2_ =
       (ushort)((short)uVar162 < sVar121) * sVar121 | ((short)uVar162 >= sVar121) * uVar162;
  auVar223._8_2_ =
       (ushort)((short)uVar163 < sVar129) * sVar129 | ((short)uVar163 >= sVar129) * uVar163;
  auVar223._10_2_ =
       (ushort)((short)uVar164 < sVar144) * sVar144 | ((short)uVar164 >= sVar144) * uVar164;
  auVar223._12_2_ =
       (ushort)((short)uVar165 < sVar146) * sVar146 | ((short)uVar165 >= sVar146) * uVar165;
  auVar223._14_2_ =
       (ushort)((short)uVar166 < sVar148) * sVar148 | ((short)uVar166 >= sVar148) * uVar166;
  auVar223 = auVar223 & auVar125;
  auVar137._0_8_ = auVar223._0_8_;
  auVar137._8_4_ = auVar223._0_4_;
  auVar137._12_4_ = auVar223._4_4_;
  auVar113 = paddsw(auVar137,_DAT_005154f0);
  sVar215 = auVar113._0_2_;
  uVar149 = (ushort)(sVar201 < sVar215) * sVar201 | (ushort)(sVar201 >= sVar215) * sVar215;
  sVar215 = auVar113._2_2_;
  uVar160 = (ushort)(sVar202 < sVar215) * sVar202 | (ushort)(sVar202 >= sVar215) * sVar215;
  sVar215 = auVar113._4_2_;
  uVar161 = (ushort)(sVar208 < sVar215) * sVar208 | (ushort)(sVar208 >= sVar215) * sVar215;
  sVar215 = auVar113._6_2_;
  uVar162 = (ushort)(sVar209 < sVar215) * sVar209 | (ushort)(sVar209 >= sVar215) * sVar215;
  sVar215 = auVar113._8_2_;
  uVar163 = (ushort)(sVar210 < sVar215) * sVar210 | (ushort)(sVar210 >= sVar215) * sVar215;
  sVar215 = auVar113._10_2_;
  uVar164 = (ushort)(sVar211 < sVar215) * sVar211 | (ushort)(sVar211 >= sVar215) * sVar215;
  sVar215 = auVar113._12_2_;
  sVar216 = auVar113._14_2_;
  uVar165 = (ushort)(sVar212 < sVar215) * sVar212 | (ushort)(sVar212 >= sVar215) * sVar215;
  uVar166 = (ushort)(sVar213 < sVar216) * sVar213 | (ushort)(sVar213 >= sVar216) * sVar216;
  auVar138._0_2_ =
       (ushort)((short)uVar149 < sVar110) * sVar110 | ((short)uVar149 >= sVar110) * uVar149;
  auVar138._2_2_ =
       (ushort)((short)uVar160 < sVar119) * sVar119 | ((short)uVar160 >= sVar119) * uVar160;
  auVar138._4_2_ =
       (ushort)((short)uVar161 < sVar120) * sVar120 | ((short)uVar161 >= sVar120) * uVar161;
  auVar138._6_2_ =
       (ushort)((short)uVar162 < sVar121) * sVar121 | ((short)uVar162 >= sVar121) * uVar162;
  auVar138._8_2_ =
       (ushort)((short)uVar163 < sVar129) * sVar129 | ((short)uVar163 >= sVar129) * uVar163;
  auVar138._10_2_ =
       (ushort)((short)uVar164 < sVar144) * sVar144 | ((short)uVar164 >= sVar144) * uVar164;
  auVar138._12_2_ =
       (ushort)((short)uVar165 < sVar146) * sVar146 | ((short)uVar165 >= sVar146) * uVar165;
  auVar138._14_2_ =
       (ushort)((short)uVar166 < sVar148) * sVar148 | ((short)uVar166 >= sVar148) * uVar166;
  auVar113 = psraw(auVar138,3);
  auVar224._0_2_ = auVar113._0_2_ + 1;
  auVar224._2_2_ = auVar113._2_2_ + 1;
  auVar224._4_2_ = auVar113._4_2_ + 1;
  auVar224._6_2_ = auVar113._6_2_ + 1;
  auVar224._8_2_ = auVar113._0_2_ + 1;
  auVar224._10_2_ = auVar113._2_2_ + 1;
  auVar224._12_2_ = auVar113._4_2_ + 1;
  auVar224._14_2_ = auVar113._6_2_ + 1;
  auVar173 = psraw(auVar224,1);
  auVar199._8_8_ = SUB168(~auVar115 & auVar173,8);
  auVar199._0_8_ = auVar113._8_8_;
  auVar139._8_8_ = SUB168(~auVar115 & auVar173,0);
  auVar139._0_8_ = auVar113._0_8_;
  auVar154 = psubsw(auVar154,auVar139);
  auVar102 = paddsw(auVar199,auVar102);
  sVar215 = auVar154._0_2_;
  uVar149 = (ushort)(sVar201 < sVar215) * sVar201 | (ushort)(sVar201 >= sVar215) * sVar215;
  sVar215 = auVar154._2_2_;
  uVar160 = (ushort)(sVar202 < sVar215) * sVar202 | (ushort)(sVar202 >= sVar215) * sVar215;
  sVar215 = auVar154._4_2_;
  uVar161 = (ushort)(sVar208 < sVar215) * sVar208 | (ushort)(sVar208 >= sVar215) * sVar215;
  sVar215 = auVar154._6_2_;
  uVar162 = (ushort)(sVar209 < sVar215) * sVar209 | (ushort)(sVar209 >= sVar215) * sVar215;
  sVar215 = auVar154._8_2_;
  uVar163 = (ushort)(sVar210 < sVar215) * sVar210 | (ushort)(sVar210 >= sVar215) * sVar215;
  sVar215 = auVar154._10_2_;
  uVar164 = (ushort)(sVar211 < sVar215) * sVar211 | (ushort)(sVar211 >= sVar215) * sVar215;
  sVar215 = auVar154._12_2_;
  sVar216 = auVar154._14_2_;
  uVar165 = (ushort)(sVar212 < sVar215) * sVar212 | (ushort)(sVar212 >= sVar215) * sVar215;
  uVar166 = (ushort)(sVar213 < sVar216) * sVar213 | (ushort)(sVar213 >= sVar216) * sVar216;
  auVar127._0_2_ =
       (ushort)((short)uVar149 < sVar110) * sVar110 | ((short)uVar149 >= sVar110) * uVar149;
  auVar127._2_2_ =
       (ushort)((short)uVar160 < sVar119) * sVar119 | ((short)uVar160 >= sVar119) * uVar160;
  auVar127._4_2_ =
       (ushort)((short)uVar161 < sVar120) * sVar120 | ((short)uVar161 >= sVar120) * uVar161;
  auVar127._6_2_ =
       (ushort)((short)uVar162 < sVar121) * sVar121 | ((short)uVar162 >= sVar121) * uVar162;
  auVar127._8_2_ =
       (ushort)((short)uVar163 < sVar129) * sVar129 | ((short)uVar163 >= sVar129) * uVar163;
  auVar127._10_2_ =
       (ushort)((short)uVar164 < sVar144) * sVar144 | ((short)uVar164 >= sVar144) * uVar164;
  auVar127._12_2_ =
       (ushort)((short)uVar165 < sVar146) * sVar146 | ((short)uVar165 >= sVar146) * uVar165;
  auVar127._14_2_ =
       (ushort)((short)uVar166 < sVar148) * sVar148 | ((short)uVar166 >= sVar148) * uVar166;
  sVar215 = auVar102._0_2_;
  uVar149 = (ushort)(sVar201 < sVar215) * sVar201 | (ushort)(sVar201 >= sVar215) * sVar215;
  sVar201 = auVar102._2_2_;
  uVar160 = (ushort)(sVar202 < sVar201) * sVar202 | (ushort)(sVar202 >= sVar201) * sVar201;
  sVar201 = auVar102._4_2_;
  uVar161 = (ushort)(sVar208 < sVar201) * sVar208 | (ushort)(sVar208 >= sVar201) * sVar201;
  sVar201 = auVar102._6_2_;
  uVar162 = (ushort)(sVar209 < sVar201) * sVar209 | (ushort)(sVar209 >= sVar201) * sVar201;
  sVar201 = auVar102._8_2_;
  uVar163 = (ushort)(sVar210 < sVar201) * sVar210 | (ushort)(sVar210 >= sVar201) * sVar201;
  sVar201 = auVar102._10_2_;
  uVar164 = (ushort)(sVar211 < sVar201) * sVar211 | (ushort)(sVar211 >= sVar201) * sVar201;
  sVar201 = auVar102._12_2_;
  sVar202 = auVar102._14_2_;
  uVar165 = (ushort)(sVar212 < sVar201) * sVar212 | (ushort)(sVar212 >= sVar201) * sVar201;
  uVar166 = (ushort)(sVar213 < sVar202) * sVar213 | (ushort)(sVar213 >= sVar202) * sVar202;
  auVar200._0_2_ =
       (ushort)((short)uVar149 < sVar110) * sVar110 | ((short)uVar149 >= sVar110) * uVar149;
  auVar200._2_2_ =
       (ushort)((short)uVar160 < sVar119) * sVar119 | ((short)uVar160 >= sVar119) * uVar160;
  auVar200._4_2_ =
       (ushort)((short)uVar161 < sVar120) * sVar120 | ((short)uVar161 >= sVar120) * uVar161;
  auVar200._6_2_ =
       (ushort)((short)uVar162 < sVar121) * sVar121 | ((short)uVar162 >= sVar121) * uVar162;
  auVar200._8_2_ =
       (ushort)((short)uVar163 < sVar129) * sVar129 | ((short)uVar163 >= sVar129) * uVar163;
  auVar200._10_2_ =
       (ushort)((short)uVar164 < sVar144) * sVar144 | ((short)uVar164 >= sVar144) * uVar164;
  auVar200._12_2_ =
       (ushort)((short)uVar165 < sVar146) * sVar146 | ((short)uVar165 >= sVar146) * uVar165;
  auVar200._14_2_ =
       (ushort)((short)uVar166 < sVar148) * sVar148 | ((short)uVar166 >= sVar148) * uVar166;
  auVar113 = paddsw(auVar127,auVar103);
  auVar173 = paddsw(auVar200,auVar103);
  auVar43._2_2_ = sStack_276;
  auVar43._0_2_ = local_278;
  auVar43._4_2_ = sStack_274;
  auVar43._6_2_ = sStack_272;
  auVar43._8_2_ = sStack_270;
  auVar43._10_2_ = sStack_26e;
  auVar43._12_2_ = sStack_26c;
  auVar43._14_2_ = uStack_26a;
  auVar44._2_2_ = sStack_266;
  auVar44._0_2_ = local_268;
  auVar44._4_2_ = sStack_264;
  auVar44._6_2_ = sStack_262;
  auVar44._8_2_ = sStack_260;
  auVar44._10_2_ = sStack_25e;
  auVar44._12_2_ = sStack_25c;
  auVar44._14_2_ = sStack_25a;
  auVar154 = psubusw(auVar41,auVar43);
  auVar102 = psubusw(auVar43,auVar41);
  auVar102 = auVar102 | auVar154;
  sVar110 = auVar102._0_2_;
  uVar149 = (ushort)(sVar167 < sVar110) * sVar110 | (ushort)(sVar167 >= sVar110) * sVar167;
  sVar110 = auVar102._2_2_;
  uVar160 = (ushort)(sVar181 < sVar110) * sVar110 | (ushort)(sVar181 >= sVar110) * sVar181;
  sVar110 = auVar102._4_2_;
  uVar161 = (ushort)(sVar183 < sVar110) * sVar110 | (ushort)(sVar183 >= sVar110) * sVar183;
  sVar110 = auVar102._6_2_;
  uVar162 = (ushort)(sVar185 < sVar110) * sVar110 | (ushort)(sVar185 >= sVar110) * sVar185;
  sVar110 = auVar102._8_2_;
  uVar163 = (ushort)(sVar186 < sVar110) * sVar110 | (ushort)(sVar186 >= sVar110) * sVar186;
  sVar110 = auVar102._10_2_;
  uVar164 = (ushort)(sVar187 < sVar110) * sVar110 | (ushort)(sVar187 >= sVar110) * sVar187;
  sVar110 = auVar102._12_2_;
  uVar165 = (ushort)(sVar188 < sVar110) * sVar110 | (ushort)(sVar188 >= sVar110) * sVar188;
  sVar110 = auVar102._14_2_;
  uVar166 = (ushort)(sVar189 < sVar110) * sVar110 | (ushort)(sVar189 >= sVar110) * sVar189;
  auVar102 = psubusw(auVar41,auVar44);
  auVar154 = psubusw(auVar44,auVar41);
  auVar154 = auVar154 | auVar102;
  auVar197 = psllw(_DAT_005154e0,auVar203);
  sVar110 = auVar154._0_2_;
  uVar149 = (sVar110 < (short)uVar149) * uVar149 | (ushort)(sVar110 >= (short)uVar149) * sVar110;
  sVar110 = auVar154._2_2_;
  uVar160 = (sVar110 < (short)uVar160) * uVar160 | (ushort)(sVar110 >= (short)uVar160) * sVar110;
  sVar110 = auVar154._4_2_;
  uVar161 = (sVar110 < (short)uVar161) * uVar161 | (ushort)(sVar110 >= (short)uVar161) * sVar110;
  sVar110 = auVar154._6_2_;
  uVar162 = (sVar110 < (short)uVar162) * uVar162 | (ushort)(sVar110 >= (short)uVar162) * sVar110;
  sVar110 = auVar154._8_2_;
  uVar163 = (sVar110 < (short)uVar163) * uVar163 | (ushort)(sVar110 >= (short)uVar163) * sVar110;
  sVar110 = auVar154._10_2_;
  uVar164 = (sVar110 < (short)uVar164) * uVar164 | (ushort)(sVar110 >= (short)uVar164) * sVar110;
  sVar110 = auVar154._12_2_;
  sVar119 = auVar154._14_2_;
  uVar165 = (sVar110 < (short)uVar165) * uVar165 | (ushort)(sVar110 >= (short)uVar165) * sVar110;
  uVar166 = (sVar119 < (short)uVar166) * uVar166 | (ushort)(sVar119 >= (short)uVar166) * sVar119;
  auVar116._0_2_ =
       ((short)uVar163 < (short)uVar149) * uVar149 | ((short)uVar163 >= (short)uVar149) * uVar163;
  auVar116._2_2_ =
       ((short)uVar164 < (short)uVar160) * uVar160 | ((short)uVar164 >= (short)uVar160) * uVar164;
  auVar116._4_2_ =
       ((short)uVar165 < (short)uVar161) * uVar161 | ((short)uVar165 >= (short)uVar161) * uVar165;
  auVar116._6_2_ =
       ((short)uVar166 < (short)uVar162) * uVar162 | ((short)uVar166 >= (short)uVar162) * uVar166;
  auVar116._8_2_ = (0 < (short)uVar163) * uVar163;
  auVar116._10_2_ = (0 < (short)uVar164) * uVar164;
  auVar116._12_2_ = (0 < (short)uVar165) * uVar165;
  auVar116._14_2_ = (0 < (short)uVar166) * uVar166;
  auVar102 = psubusw(auVar116,auVar197);
  auVar117._0_2_ = -(ushort)(auVar102._0_2_ == 0);
  auVar117._2_2_ = -(ushort)(auVar102._2_2_ == 0);
  auVar117._4_2_ = -(ushort)(auVar102._4_2_ == 0);
  auVar117._6_2_ = -(ushort)(auVar102._6_2_ == 0);
  auVar117._8_2_ = -(ushort)(auVar102._8_2_ == 0);
  auVar117._10_2_ = -(ushort)(auVar102._10_2_ == 0);
  auVar117._12_2_ = -(ushort)(auVar102._12_2_ == 0);
  auVar117._14_2_ = -(ushort)(auVar102._14_2_ == 0);
  auVar117 = auVar117 & auVar125;
  auVar204._0_8_ = auVar117._0_8_;
  auVar204._8_4_ = auVar117._0_4_;
  auVar204._12_4_ = auVar117._4_4_;
  auVar97._0_2_ = -(ushort)(auVar117._0_2_ == 0);
  auVar97._2_2_ = -(ushort)(auVar117._2_2_ == 0);
  auVar97._4_2_ = -(ushort)(auVar117._4_2_ == 0);
  auVar97._6_2_ = -(ushort)(auVar117._6_2_ == 0);
  auVar97._8_2_ = -(ushort)(auVar117._0_2_ == 0);
  auVar97._10_2_ = -(ushort)(auVar117._2_2_ == 0);
  auVar97._12_2_ = -(ushort)(auVar117._4_2_ == 0);
  auVar97._14_2_ = -(ushort)(auVar117._6_2_ == 0);
  local_298 = auVar173._0_2_;
  sStack_296 = auVar173._2_2_;
  sStack_294 = auVar173._4_2_;
  sStack_292 = auVar173._6_2_;
  sStack_290 = auVar113._0_2_;
  sStack_28e = auVar113._2_2_;
  sStack_28c = auVar113._4_2_;
  uStack_28a = auVar113._6_2_;
  local_288 = auVar173._8_2_;
  sStack_286 = auVar173._10_2_;
  sStack_284 = auVar173._12_2_;
  sStack_282 = auVar173._14_2_;
  sStack_280 = auVar113._8_2_;
  sStack_27e = auVar113._10_2_;
  sStack_27c = auVar113._12_2_;
  sStack_27a = auVar113._14_2_;
  if ((ushort)((ushort)(SUB161(auVar97 >> 7,0) & 1) | (ushort)(SUB161(auVar97 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar97 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar97 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar97 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar97 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar97 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar97 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar97 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar97 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar97 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar97 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar97 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar97 >> 0x6f,0) & 1) << 0xd |
               (ushort)((byte)(auVar97._14_2_ >> 7) & 1) << 0xe | auVar97._14_2_ & 0x8000) != 0xffff
     ) {
    auVar45._2_2_ = sStack_256;
    auVar45._0_2_ = local_258;
    auVar45._4_2_ = sStack_254;
    auVar45._6_2_ = sStack_252;
    auVar45._8_2_ = sStack_250;
    auVar45._10_2_ = sStack_24e;
    auVar45._12_2_ = sStack_24c;
    auVar45._14_2_ = uStack_24a;
    auVar46._2_2_ = sStack_246;
    auVar46._0_2_ = local_248;
    auVar46._4_2_ = sStack_244;
    auVar46._6_2_ = sStack_242;
    auVar46._8_2_ = sStack_240;
    auVar46._10_2_ = sStack_23e;
    auVar46._12_2_ = sStack_23c;
    auVar46._14_2_ = sStack_23a;
    auVar154 = psubusw(auVar41,auVar45);
    auVar102 = psubusw(auVar45,auVar41);
    auVar102 = auVar102 | auVar154;
    auVar113 = psubusw(auVar41,auVar46);
    auVar154 = psubusw(auVar46,auVar41);
    auVar154 = auVar154 | auVar113;
    sVar110 = auVar102._0_2_;
    sVar119 = auVar154._0_2_;
    uVar149 = (ushort)(sVar119 < sVar110) * sVar110 | (ushort)(sVar119 >= sVar110) * sVar119;
    sVar110 = auVar102._2_2_;
    sVar119 = auVar154._2_2_;
    uVar160 = (ushort)(sVar119 < sVar110) * sVar110 | (ushort)(sVar119 >= sVar110) * sVar119;
    sVar110 = auVar102._4_2_;
    sVar119 = auVar154._4_2_;
    uVar161 = (ushort)(sVar119 < sVar110) * sVar110 | (ushort)(sVar119 >= sVar110) * sVar119;
    sVar110 = auVar102._6_2_;
    sVar119 = auVar154._6_2_;
    uVar162 = (ushort)(sVar119 < sVar110) * sVar110 | (ushort)(sVar119 >= sVar110) * sVar119;
    sVar110 = auVar102._8_2_;
    sVar119 = auVar154._8_2_;
    uVar163 = (ushort)(sVar119 < sVar110) * sVar110 | (ushort)(sVar119 >= sVar110) * sVar119;
    sVar110 = auVar102._10_2_;
    sVar119 = auVar154._10_2_;
    uVar164 = (ushort)(sVar119 < sVar110) * sVar110 | (ushort)(sVar119 >= sVar110) * sVar119;
    sVar110 = auVar102._12_2_;
    sVar119 = auVar154._12_2_;
    sVar120 = auVar154._14_2_;
    uVar165 = (ushort)(sVar119 < sVar110) * sVar110 | (ushort)(sVar119 >= sVar110) * sVar119;
    sVar110 = auVar102._14_2_;
    uVar166 = (ushort)(sVar120 < sVar110) * sVar110 | (ushort)(sVar120 >= sVar110) * sVar120;
    auVar102 = psubusw(local_238,auVar41);
    auVar154 = psubusw(auVar41,local_238);
    auVar154 = auVar154 | auVar102;
    sVar110 = auVar154._0_2_;
    uVar149 = (sVar110 < (short)uVar149) * uVar149 | (ushort)(sVar110 >= (short)uVar149) * sVar110;
    sVar110 = auVar154._2_2_;
    uVar160 = (sVar110 < (short)uVar160) * uVar160 | (ushort)(sVar110 >= (short)uVar160) * sVar110;
    sVar110 = auVar154._4_2_;
    uVar161 = (sVar110 < (short)uVar161) * uVar161 | (ushort)(sVar110 >= (short)uVar161) * sVar110;
    sVar110 = auVar154._6_2_;
    uVar162 = (sVar110 < (short)uVar162) * uVar162 | (ushort)(sVar110 >= (short)uVar162) * sVar110;
    sVar110 = auVar154._8_2_;
    uVar163 = (sVar110 < (short)uVar163) * uVar163 | (ushort)(sVar110 >= (short)uVar163) * sVar110;
    sVar110 = auVar154._10_2_;
    uVar164 = (sVar110 < (short)uVar164) * uVar164 | (ushort)(sVar110 >= (short)uVar164) * sVar110;
    sVar110 = auVar154._12_2_;
    sVar119 = auVar154._14_2_;
    uVar165 = (sVar110 < (short)uVar165) * uVar165 | (ushort)(sVar110 >= (short)uVar165) * sVar110;
    uVar166 = (sVar119 < (short)uVar166) * uVar166 | (ushort)(sVar119 >= (short)uVar166) * sVar119;
    auVar104._0_2_ =
         ((short)uVar163 < (short)uVar149) * uVar149 | ((short)uVar163 >= (short)uVar149) * uVar163;
    auVar104._2_2_ =
         ((short)uVar164 < (short)uVar160) * uVar160 | ((short)uVar164 >= (short)uVar160) * uVar164;
    auVar104._4_2_ =
         ((short)uVar165 < (short)uVar161) * uVar161 | ((short)uVar165 >= (short)uVar161) * uVar165;
    auVar104._6_2_ =
         ((short)uVar166 < (short)uVar162) * uVar162 | ((short)uVar166 >= (short)uVar162) * uVar166;
    auVar104._8_2_ = (0 < (short)uVar163) * uVar163;
    auVar104._10_2_ = (0 < (short)uVar164) * uVar164;
    auVar104._12_2_ = (0 < (short)uVar165) * uVar165;
    auVar104._14_2_ = (0 < (short)uVar166) * uVar166;
    auVar102 = psubusw(auVar104,auVar197);
    auVar105._0_2_ = -(ushort)(auVar102._0_2_ == 0);
    auVar105._2_2_ = -(ushort)(auVar102._2_2_ == 0);
    auVar105._4_2_ = -(ushort)(auVar102._4_2_ == 0);
    auVar105._6_2_ = -(ushort)(auVar102._6_2_ == 0);
    auVar105._8_2_ = -(ushort)(auVar102._8_2_ == 0);
    auVar105._10_2_ = -(ushort)(auVar102._10_2_ == 0);
    auVar105._12_2_ = -(ushort)(auVar102._12_2_ == 0);
    auVar105._14_2_ = -(ushort)(auVar102._14_2_ == 0);
    auVar105 = auVar105 & auVar117;
    sVar167 = sVar82 + sVar194 + local_278;
    sVar181 = sVar83 + sVar195 + sStack_276;
    sVar183 = sVar84 + sVar76 + sStack_274;
    sVar185 = sVar85 + sVar77 + sStack_272;
    sVar186 = sVar86 + sVar78 + sStack_270;
    sVar187 = sVar87 + sVar79 + sStack_26e;
    sVar188 = sVar88 + sVar80 + sStack_26c;
    sVar189 = sVar89 + uVar81 + uStack_26a;
    sVar110 = sVar186 + sVar167 + 4;
    sVar119 = sVar187 + sVar181 + 4;
    sVar120 = sVar188 + sVar183 + 4;
    sVar121 = sVar189 + sVar185 + 4;
    local_108 = (ushort)(sVar194 + local_268 + sVar110) >> 3;
    uStack_106 = (ushort)(sVar195 + sStack_266 + sVar119) >> 3;
    uStack_104 = (ushort)(sVar76 + sStack_264 + sVar120) >> 3;
    uStack_102 = (ushort)(sVar77 + sStack_262 + sVar121) >> 3;
    uStack_100 = (ushort)(sVar184 + sVar193 + sVar110) >> 3;
    uStack_fe = (ushort)(uVar29 + uVar26 + sVar119) >> 3;
    uStack_fc = (ushort)(sVar147 + sVar190 + sVar120) >> 3;
    uStack_fa = (ushort)(uVar37 + uVar34 + sVar121) >> 3;
    local_f8 = (ushort)((sVar110 - sVar182) + sVar82 + local_268 * 2) >> 3;
    uStack_f6 = (ushort)((sVar119 - uVar28) + sVar83 + sStack_266 * 2) >> 3;
    uStack_f4 = (ushort)((sVar120 - sVar145) + sVar84 + sStack_264 * 2) >> 3;
    uStack_f2 = (ushort)((sVar121 - uVar36) + sVar85 + sStack_262 * 2) >> 3;
    uStack_f0 = (ushort)((sVar110 - local_278) + sVar86 + sStack_260 * 2) >> 3;
    uStack_ee = (ushort)((sVar119 - sStack_276) + sVar87 + sStack_25e * 2) >> 3;
    uStack_ec = (ushort)((sVar120 - sStack_274) + sVar88 + sStack_25c * 2) >> 3;
    uStack_ea = (ushort)((sVar121 - sStack_272) + sVar89 + sStack_25a * 2) >> 3;
    auVar214._0_8_ = auVar105._0_8_;
    auVar214._8_4_ = auVar105._0_4_;
    auVar214._12_4_ = auVar105._4_4_;
    local_e8 = (ushort)(((local_278 + local_268 * 3) - sVar180) + (sVar110 - sVar182)) >> 3;
    uStack_e6 = (ushort)(((sStack_276 + sStack_266 * 3) - uVar27) + (sVar119 - uVar28)) >> 3;
    uStack_e4 = (ushort)(((sStack_274 + sStack_264 * 3) - sVar143) + (sVar120 - sVar145)) >> 3;
    uStack_e2 = (ushort)(((sStack_272 + sStack_262 * 3) - uVar35) + (sVar121 - uVar36)) >> 3;
    uStack_e0 = (ushort)(((sStack_270 + sStack_260 * 3) - sVar82) + (sVar110 - local_278)) >> 3;
    uStack_de = (ushort)(((sStack_26e + sStack_25e * 3) - sVar83) + (sVar119 - sStack_276)) >> 3;
    uStack_dc = (ushort)(((sStack_26c + sStack_25c * 3) - sVar84) + (sVar120 - sStack_274)) >> 3;
    uStack_da = (ushort)(((uStack_26a + sStack_25a * 3) - sVar85) + (sVar121 - sStack_272)) >> 3;
    auVar106._0_2_ = -(ushort)(auVar105._0_2_ == 0);
    auVar106._2_2_ = -(ushort)(auVar105._2_2_ == 0);
    auVar106._4_2_ = -(ushort)(auVar105._4_2_ == 0);
    auVar106._6_2_ = -(ushort)(auVar105._6_2_ == 0);
    auVar106._8_2_ = -(ushort)(auVar105._0_2_ == 0);
    auVar106._10_2_ = -(ushort)(auVar105._2_2_ == 0);
    auVar106._12_2_ = -(ushort)(auVar105._4_2_ == 0);
    auVar106._14_2_ = -(ushort)(auVar105._6_2_ == 0);
    uVar149 = ((ushort)(SUB161(auVar106 >> 7,0) & 1) | (ushort)(SUB161(auVar106 >> 0xf,0) & 1) << 1
               | (ushort)(SUB161(auVar106 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar106 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar106 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar106 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar106 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar106 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar106 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar106 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar106 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar106 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar106 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar106 >> 0x6f,0) & 1) << 0xd |
               (ushort)((byte)(auVar106._14_2_ >> 7) & 1) << 0xe | auVar106._14_2_ & 0x8000) ^
              0xffff;
    if (uVar149 != 0) {
      sVar215 = local_258 + local_248 + local_268;
      sVar216 = sStack_256 + sStack_246 + sStack_266;
      sVar217 = sStack_254 + sStack_244 + sStack_264;
      sVar218 = sStack_252 + sStack_242 + sStack_262;
      sVar219 = sStack_250 + sStack_240 + sStack_260;
      sVar220 = sStack_24e + sStack_23e + sStack_25e;
      sVar221 = sStack_24c + sStack_23c + sStack_25c;
      sVar222 = uStack_24a + sStack_23a + sStack_25a;
      sVar129 = sVar219 + sVar186 + sVar215 + sVar167 + 8;
      sVar144 = sVar220 + sVar187 + sVar216 + sVar181 + 8;
      sVar146 = sVar221 + sVar188 + sVar217 + sVar183 + 8;
      sVar148 = sVar222 + sVar189 + sVar218 + sVar185 + 8;
      sVar110 = sVar129 - auVar101._10_2_;
      sVar119 = sVar144 - uVar31;
      sVar120 = sVar146 - auVar118._10_2_;
      sVar121 = sVar148 - uVar39;
      sVar201 = local_238._0_2_;
      sVar202 = local_238._2_2_;
      sVar208 = local_238._4_2_;
      sVar209 = local_238._6_2_;
      sVar210 = local_238._8_2_;
      sVar211 = local_238._10_2_;
      sVar212 = local_238._12_2_;
      sVar213 = local_238._14_2_;
      local_d8 = (ushort)(sVar193 + sVar82 + sVar194 + sVar201 + sVar129) >> 4;
      uStack_d6 = (ushort)(uVar26 + sVar83 + sVar195 + sVar202 + sVar144) >> 4;
      uStack_d4 = (ushort)(sVar190 + sVar84 + sVar76 + sVar208 + sVar146) >> 4;
      uStack_d2 = (ushort)(uVar34 + sVar85 + sVar77 + sVar209 + sVar148) >> 4;
      uStack_d0 = (ushort)(sVar194 + sVar86 + sVar78 + sVar210 + sVar129) >> 4;
      uStack_ce = (ushort)(sVar195 + sVar87 + sVar79 + sVar211 + sVar144) >> 4;
      uStack_cc = (ushort)(sVar76 + sVar88 + sVar80 + sVar212 + sVar146) >> 4;
      uStack_ca = (ushort)(sVar77 + sVar89 + uVar81 + sVar213 + sVar148) >> 4;
      local_c8 = (ushort)(sVar110 + sVar167 + sVar201 * 2) >> 4;
      uStack_c6 = (ushort)(sVar119 + sVar181 + sVar202 * 2) >> 4;
      uStack_c4 = (ushort)(sVar120 + sVar183 + sVar208 * 2) >> 4;
      uStack_c2 = (ushort)(sVar121 + sVar185 + sVar209 * 2) >> 4;
      uStack_c0 = (ushort)((sVar129 - local_248) + sVar186 + sVar210 * 2) >> 4;
      uStack_be = (ushort)((sVar144 - sStack_246) + sVar187 + sVar211 * 2) >> 4;
      uStack_bc = (ushort)((sVar146 - sStack_244) + sVar188 + sVar212 * 2) >> 4;
      uStack_ba = (ushort)((sVar148 - sStack_242) + sVar189 + sVar213 * 2) >> 4;
      sVar110 = sVar110 - auVar101._8_2_;
      sVar119 = sVar119 - uVar30;
      sVar120 = sVar120 - auVar118._8_2_;
      sVar121 = sVar121 - uVar38;
      sVar190 = (sVar129 - local_248) - local_258;
      sVar193 = (sVar144 - sStack_246) - sStack_256;
      sVar194 = (sVar146 - sStack_244) - sStack_254;
      sVar195 = (sVar148 - sStack_242) - sStack_252;
      local_b8 = (ushort)(sVar110 + sVar82 + local_278 + local_268 + sVar201 * 3) >> 4;
      uStack_b6 = (ushort)(sVar119 + sVar83 + sStack_276 + sStack_266 + sVar202 * 3) >> 4;
      uStack_b4 = (ushort)(sVar120 + sVar84 + sStack_274 + sStack_264 + sVar208 * 3) >> 4;
      uStack_b2 = (ushort)(sVar121 + sVar85 + sStack_272 + sStack_262 + sVar209 * 3) >> 4;
      uStack_b0 = (ushort)(sVar190 + sVar86 + sStack_270 + sStack_260 + sVar210 * 3) >> 4;
      uStack_ae = (ushort)(sVar193 + sVar87 + sStack_26e + sStack_25e + sVar211 * 3) >> 4;
      uStack_ac = (ushort)(sVar194 + sVar88 + sStack_26c + sStack_25c + sVar212 * 3) >> 4;
      uStack_aa = (ushort)(sVar195 + sVar89 + uStack_26a + sStack_25a + sVar213 * 3) >> 4;
      sVar110 = sVar110 - sVar184;
      sVar119 = sVar119 - uVar29;
      sVar120 = sVar120 - sVar147;
      sVar121 = sVar121 - uVar37;
      auVar118 = psllw(local_238,2);
      sVar190 = sVar190 - local_268;
      sVar193 = sVar193 - sStack_266;
      sVar194 = sVar194 - sStack_264;
      sVar195 = sVar195 - sStack_262;
      local_a8 = (ushort)(sVar110 + local_268 + local_258 + local_278 + auVar118._0_2_) >> 4;
      uStack_a6 = (ushort)(sVar119 + sStack_266 + sStack_256 + sStack_276 + auVar118._2_2_) >> 4;
      uStack_a4 = (ushort)(sVar120 + sStack_264 + sStack_254 + sStack_274 + auVar118._4_2_) >> 4;
      uStack_a2 = (ushort)(sVar121 + sStack_262 + sStack_252 + sStack_272 + auVar118._6_2_) >> 4;
      uStack_a0 = (ushort)(sVar190 + sStack_260 + sStack_250 + sStack_270 + auVar118._8_2_) >> 4;
      uStack_9e = (ushort)(sVar193 + sStack_25e + sStack_24e + sStack_26e + auVar118._10_2_) >> 4;
      uStack_9c = (ushort)(sVar194 + sStack_25c + sStack_24c + sStack_26c + auVar118._12_2_) >> 4;
      uStack_9a = (ushort)(sVar195 + sStack_25a + uStack_24a + uStack_26a + auVar118._14_2_) >> 4;
      sVar110 = sVar110 - sVar182;
      sVar119 = sVar119 - uVar28;
      sVar120 = sVar120 - sVar145;
      sVar121 = sVar121 - uVar36;
      sVar190 = sVar190 - local_278;
      sVar193 = sVar193 - sStack_276;
      sVar194 = sVar194 - sStack_274;
      sVar195 = sVar195 - sStack_272;
      local_98 = (ushort)(sVar110 + auVar118._0_2_ + sVar201 + sVar215) >> 4;
      uStack_96 = (ushort)(sVar119 + auVar118._2_2_ + sVar202 + sVar216) >> 4;
      uStack_94 = (ushort)(sVar120 + auVar118._4_2_ + sVar208 + sVar217) >> 4;
      uStack_92 = (ushort)(sVar121 + auVar118._6_2_ + sVar209 + sVar218) >> 4;
      uStack_90 = (ushort)(sVar190 + auVar118._8_2_ + sVar210 + sVar219) >> 4;
      uStack_8e = (ushort)(sVar193 + auVar118._10_2_ + sVar211 + sVar220) >> 4;
      uStack_8c = (ushort)(sVar194 + auVar118._12_2_ + sVar212 + sVar221) >> 4;
      uStack_8a = (ushort)(sVar195 + auVar118._14_2_ + sVar213 + sVar222) >> 4;
      uStack_88 = (ushort)(((local_258 + local_248 + sVar201 * 7) - sVar180) + sVar110) >> 4;
      uStack_86 = (ushort)(((sStack_256 + sStack_246 + sVar202 * 7) - uVar27) + sVar119) >> 4;
      uStack_84 = (ushort)(((sStack_254 + sStack_244 + sVar208 * 7) - sVar143) + sVar120) >> 4;
      uStack_82 = (ushort)(((sStack_252 + sStack_242 + sVar209 * 7) - uVar35) + sVar121) >> 4;
      pq[0][0]._0_2_ = (ushort)(((sStack_250 + sStack_240 + sVar210 * 7) - sVar82) + sVar190) >> 4;
      pq[0][0]._2_2_ = (ushort)(((sStack_24e + sStack_23e + sVar211 * 7) - sVar83) + sVar193) >> 4;
      pq[0][0]._4_2_ = (ushort)(((sStack_24c + sStack_23c + sVar212 * 7) - sVar84) + sVar194) >> 4;
      pq[0][0]._6_2_ = (ushort)(((uStack_24a + sStack_23a + sVar213 * 7) - sVar85) + sVar195) >> 4;
    }
    auVar107._8_4_ = 0xffffffff;
    auVar107._0_8_ = 0xffffffffffffffff;
    auVar107._12_4_ = 0xffffffff;
    lVar90 = 0;
    do {
      auVar118 = *(undefined1 (*) [16])((long)&local_108 + lVar90) & auVar204;
      *(undefined1 (*) [16])((long)&local_108 + lVar90) = auVar118;
      *(undefined1 (*) [16])((long)&local_298 + lVar90) =
           auVar118 | *(undefined1 (*) [16])((long)&local_298 + lVar90) & (auVar107 ^ auVar204);
      lVar90 = lVar90 + 0x10;
    } while (lVar90 != 0x30);
    if (uVar149 != 0) {
      auVar108._8_4_ = 0xffffffff;
      auVar108._0_8_ = 0xffffffffffffffff;
      auVar108._12_4_ = 0xffffffff;
      lVar90 = 0;
      do {
        auVar118 = *(undefined1 (*) [16])((long)&local_d8 + lVar90) & auVar214;
        *(undefined1 (*) [16])((long)&local_d8 + lVar90) = auVar118;
        *(undefined1 (*) [16])((long)&local_298 + lVar90) =
             auVar118 | *(undefined1 (*) [16])((long)&local_298 + lVar90) & (auVar108 ^ auVar214);
        lVar90 = lVar90 + 0x10;
      } while (lVar90 != 0x60);
    }
  }
  auVar68._4_8_ = auVar95._8_8_;
  auVar68._0_4_ = uVar150;
  auVar68._12_4_ = 0;
  auVar207._0_12_ = SUB1612(auVar68 << 0x20,0);
  auVar207._12_2_ = uVar24;
  auVar207._14_2_ = uVar25;
  auVar206._12_4_ = auVar207._12_4_;
  auVar206._0_10_ = SUB1610(auVar68 << 0x20,0);
  auVar206._10_2_ = auVar99._2_2_;
  auVar69._4_2_ = auVar99._0_2_;
  auVar69._0_4_ = uVar150;
  auVar69._6_6_ = auVar206._10_6_;
  auVar54._4_8_ = auVar69._4_8_;
  auVar54._2_2_ = uVar23;
  auVar54._0_2_ = uVar22;
  auVar205._0_4_ = auVar98._0_4_;
  auVar205._4_12_ = auVar54;
  Var70 = CONCAT64(CONCAT42(CONCAT22(sStack_252,sStack_242),sStack_254),
                   CONCAT22(sStack_244,sStack_242));
  auVar55._4_8_ = (long)((unkuint10)Var70 >> 0x10);
  auVar55._2_2_ = sStack_256;
  auVar55._0_2_ = sStack_246;
  Var71 = CONCAT64(CONCAT42(CONCAT22(sStack_272,sStack_262),sStack_274),
                   CONCAT22(sStack_264,sStack_262));
  auVar56._4_8_ = (long)((unkuint10)Var71 >> 0x10);
  auVar56._2_2_ = sStack_276;
  auVar56._0_2_ = sStack_266;
  auVar156._0_4_ = CONCAT22(local_278,local_268);
  auVar156._4_12_ = auVar56;
  Var72 = CONCAT64(CONCAT42(CONCAT22(sStack_292,sStack_282),sStack_294),
                   CONCAT22(sStack_284,sStack_282));
  auVar57._4_8_ = (long)((unkuint10)Var72 >> 0x10);
  auVar57._2_2_ = sStack_296;
  auVar57._0_2_ = sStack_286;
  auVar109._0_8_ = auVar205._0_8_;
  auVar109._8_4_ = auVar54._0_4_;
  auVar109._12_4_ = auVar55._0_4_;
  auVar176._0_8_ = auVar156._0_8_;
  auVar176._8_4_ = auVar56._0_4_;
  auVar176._12_4_ = auVar57._0_4_;
  auVar142._0_12_ = ZEXT212(uStack_28a) << 0x30;
  auVar142._12_2_ = uStack_28a;
  auVar142._14_2_ = sStack_27a;
  auVar141._12_4_ = auVar142._12_4_;
  auVar141._0_10_ = (unkuint10)uStack_28a << 0x30;
  auVar141._10_2_ = sStack_27c;
  Var73 = CONCAT64(auVar141._10_6_,CONCAT22(sStack_28c,uStack_28a));
  auVar58._4_8_ = (long)((unkuint10)Var73 >> 0x10);
  auVar58._2_2_ = sStack_27e;
  auVar58._0_2_ = sStack_28e;
  auVar140._0_4_ = CONCAT22(sStack_280,sStack_290);
  auVar140._4_12_ = auVar58;
  auVar99._0_12_ = ZEXT212(uStack_26a) << 0x30;
  auVar99._12_2_ = uStack_26a;
  auVar99._14_2_ = sStack_25a;
  auVar98._12_4_ = auVar99._12_4_;
  auVar98._0_10_ = (unkuint10)uStack_26a << 0x30;
  auVar98._10_2_ = sStack_25c;
  Var74 = CONCAT64(auVar98._10_6_,CONCAT22(sStack_26c,uStack_26a));
  auVar59._4_8_ = (long)((unkuint10)Var74 >> 0x10);
  auVar59._2_2_ = sStack_25e;
  auVar59._0_2_ = sStack_26e;
  auVar159._0_12_ = ZEXT212(uStack_24a) << 0x30;
  auVar159._12_2_ = uStack_24a;
  auVar159._14_2_ = sStack_23a;
  auVar158._12_4_ = auVar159._12_4_;
  auVar158._0_10_ = (unkuint10)uStack_24a << 0x30;
  auVar158._10_2_ = sStack_23c;
  Var75 = CONCAT64(auVar158._10_6_,CONCAT22(sStack_24c,uStack_24a));
  auVar60._4_8_ = (long)((unkuint10)Var75 >> 0x10);
  auVar60._2_2_ = sStack_23e;
  auVar60._0_2_ = sStack_24e;
  auVar157._0_4_ = CONCAT22(sStack_240,sStack_250);
  auVar157._4_12_ = auVar60;
  auVar179._8_4_ = 0;
  auVar179._0_8_ = local_198;
  auVar179._12_2_ = uVar40;
  auVar179._14_2_ = uVar40;
  auVar178._12_4_ = auVar179._12_4_;
  auVar178._8_2_ = 0;
  auVar178._0_8_ = local_198;
  auVar178._10_2_ = uVar122;
  auVar177._10_6_ = auVar178._10_6_;
  auVar177._8_2_ = uVar122;
  auVar177._0_8_ = local_198;
  auVar61._4_8_ = auVar177._8_8_;
  auVar61._2_2_ = uVar33;
  auVar61._0_2_ = uVar32;
  auVar128._0_8_ = auVar140._0_8_;
  auVar128._8_4_ = auVar58._0_4_;
  auVar128._12_4_ = auVar59._0_4_;
  auVar192._0_8_ = auVar157._0_8_;
  auVar192._8_4_ = auVar60._0_4_;
  auVar192._12_4_ = auVar61._0_4_;
  *(ulong *)(s + -8) = CONCAT44(CONCAT22(local_258,local_248),auVar205._0_4_);
  *(ulong *)(s + -4) = CONCAT44(CONCAT22(local_298,local_288),auVar156._0_4_);
  *(ulong *)s = CONCAT44(CONCAT22(sStack_260,sStack_270),auVar140._0_4_);
  *(ulong *)(s + 4) = CONCAT44(auVar101._12_4_,auVar157._0_4_);
  *(long *)(s + (long)pitch + -8) = auVar109._8_8_;
  *(long *)(s + (long)pitch + -8 + 4) = auVar176._8_8_;
  *(long *)(s + pitch) = auVar128._8_8_;
  *(long *)(s + pitch + 4) = auVar192._8_8_;
  puVar1 = s + lVar91 + -8;
  *(int *)puVar1 = auVar69._4_4_;
  *(int *)(puVar1 + 2) = (int)((unkuint10)Var70 >> 0x10);
  *(int *)(puVar1 + 4) = (int)((unkuint10)Var71 >> 0x10);
  *(int *)(puVar1 + 6) = (int)((unkuint10)Var72 >> 0x10);
  puVar1 = s + lVar91;
  *(int *)puVar1 = (int)((unkuint10)Var73 >> 0x10);
  *(int *)(puVar1 + 2) = (int)((unkuint10)Var74 >> 0x10);
  *(int *)(puVar1 + 4) = (int)((unkuint10)Var75 >> 0x10);
  *(int *)(puVar1 + 6) = auVar177._8_4_;
  *(undefined4 *)(s + lVar92 + -4) = auVar206._12_4_;
  *(uint *)(s + lVar92 + -2) = CONCAT22(sStack_252,sStack_242);
  *(uint *)(s + lVar92) = CONCAT22(sStack_272,sStack_262);
  *(uint *)(s + lVar92 + 2) = CONCAT22(sStack_292,sStack_282);
  *(undefined4 *)(s + lVar92 + 4) = auVar141._12_4_;
  *(undefined4 *)(s + lVar92 + 6) = auVar98._12_4_;
  *(undefined4 *)(s + lVar92 + 8) = auVar158._12_4_;
  *(undefined4 *)(s + lVar92 + 10) = auVar178._12_4_;
  return;
}

Assistant:

void aom_highbd_lpf_vertical_14_sse2(uint16_t *s, int pitch,
                                     const uint8_t *blimit,
                                     const uint8_t *limit,
                                     const uint8_t *thresh, int bd) {
  __m128i q[7], p[7], pq[7];
  __m128i p6, p5, p4, p3;
  __m128i p6_2, p5_2, p4_2, p3_2;
  __m128i d0, d1, d2, d3;
  __m128i d0_2, d1_2, d2_2, d3_2, d7_2;

  p6 = _mm_loadu_si128((__m128i *)((s - 8) + 0 * pitch));
  p5 = _mm_loadu_si128((__m128i *)((s - 8) + 1 * pitch));
  p4 = _mm_loadu_si128((__m128i *)((s - 8) + 2 * pitch));
  p3 = _mm_loadu_si128((__m128i *)((s - 8) + 3 * pitch));

  highbd_transpose4x8_8x4_sse2(&p6, &p5, &p4, &p3, &d0, &p[6], &p[5], &p[4],
                               &p[3], &p[2], &p[1], &p[0]);

  p6_2 = _mm_loadu_si128((__m128i *)(s + 0 * pitch));
  p5_2 = _mm_loadu_si128((__m128i *)(s + 1 * pitch));
  p4_2 = _mm_loadu_si128((__m128i *)(s + 2 * pitch));
  p3_2 = _mm_loadu_si128((__m128i *)(s + 3 * pitch));

  highbd_transpose4x8_8x4_sse2(&p6_2, &p5_2, &p4_2, &p3_2, &q[0], &q[1], &q[2],
                               &q[3], &q[4], &q[5], &q[6], &d7_2);

  highbd_lpf_internal_14_sse2(p, q, pq, blimit, limit, thresh, bd);

  highbd_transpose8x8_low_sse2(&d0, &p[6], &pq[5], &pq[4], &pq[3], &pq[2],
                               &pq[1], &pq[0], &d0, &d1, &d2, &d3);

  q[0] = _mm_srli_si128(pq[0], 8);
  q[1] = _mm_srli_si128(pq[1], 8);
  q[2] = _mm_srli_si128(pq[2], 8);
  q[3] = _mm_srli_si128(pq[3], 8);
  q[4] = _mm_srli_si128(pq[4], 8);
  q[5] = _mm_srli_si128(pq[5], 8);

  highbd_transpose8x8_low_sse2(&q[0], &q[1], &q[2], &q[3], &q[4], &q[5], &q[6],
                               &d7_2, &d0_2, &d1_2, &d2_2, &d3_2);

  _mm_storeu_si128((__m128i *)(s - 8 + 0 * pitch), d0);
  _mm_storeu_si128((__m128i *)(s + 0 * pitch), d0_2);

  _mm_storeu_si128((__m128i *)(s - 8 + 1 * pitch), d1);
  _mm_storeu_si128((__m128i *)(s + 1 * pitch), d1_2);

  _mm_storeu_si128((__m128i *)(s - 8 + 2 * pitch), d2);
  _mm_storeu_si128((__m128i *)(s + 2 * pitch), d2_2);

  _mm_storeu_si128((__m128i *)(s - 8 + 3 * pitch), d3);
  _mm_storeu_si128((__m128i *)(s + 3 * pitch), d3_2);
}